

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void huc1_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  byte bVar1;
  uint uVar2;
  byte bank;
  undefined3 in_register_00000011;
  undefined6 in_register_00000032;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = CONCAT62(in_register_00000032,addr) >> 0xd & 0x7ffff;
  if (3 < (ushort)uVar3) {
    bVar1 = (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff & 0x3f;
    uVar2 = 1;
    if (1 < bVar1) {
      uVar2 = (uint)bVar1;
    }
    bVar1 = (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
    bank = bVar1 & 3;
    uVar4 = (uint)(byte)(bVar1 << 6);
    if ((e->state).memory_map_state.field_3.mbc1.bank_mode == BANK_MODE_ROM) {
      bank = 0;
    }
    else {
      uVar4 = 0;
    }
    (e->state).memory_map_state.rom_base[1] =
         ((uVar4 | uVar2) & s_rom_bank_count[e->cart_info->rom_size] - 1) << 0xe;
    set_ext_ram_bank(e,bank);
    return;
  }
  (*(code *)(&DAT_00113e44 + *(int *)(&DAT_00113e44 + uVar3 * 4)))
            (e,uVar3,CONCAT31(in_register_00000011,value),
             &DAT_00113e44 + *(int *)(&DAT_00113e44 + uVar3 * 4));
  return;
}

Assistant:

static void huc1_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  Huc1* huc1 = &MMAP_STATE.huc1;
  switch (addr >> 13) {
    case 0: /* 0000-1fff */
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
      break;
    case 1: /* 2000-3fff */
      huc1->byte_2000_3fff = value;
      break;
    case 2: /* 4000-5fff */
      huc1->byte_4000_5fff = value;
      break;
    case 3: /* 6000-7fff */
      huc1->bank_mode = (BankMode)(value & 1);
      break;
  }

  u16 rom1_bank = huc1->byte_2000_3fff & HUC1_ROM_BANK_LO_SELECT_MASK;
  if (rom1_bank == 0) {
    rom1_bank++;
  }

  u8 ext_ram_bank;
  if (huc1->bank_mode == BANK_MODE_ROM) {
    rom1_bank |= (huc1->byte_4000_5fff & HUC1_BANK_HI_SELECT_MASK)
                 << HUC1_BANK_HI_SHIFT;
    ext_ram_bank = 0;
  } else {
    ext_ram_bank = huc1->byte_4000_5fff & HUC1_BANK_HI_SELECT_MASK;
  }
  set_rom_bank(e, 1, rom1_bank);
  set_ext_ram_bank(e, ext_ram_bank);
}